

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::Calendar::computeFields(Calendar *this,UErrorCode *ec)

{
  double dVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  UErrorCode *ec_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar7;
  int32_t dstOffset;
  int32_t rawOffset;
  int local_40;
  int local_3c;
  undefined1 local_38 [16];
  
  if (U_ZERO_ERROR < *ec) {
    return;
  }
  dVar7 = this->fTime;
  (*(this->fZone->super_UObject)._vptr_UObject[6])(this->fZone,0,&local_3c,&local_40,ec);
  uVar4 = 0x80067;
  lVar6 = -0x17;
  do {
    this->fStamp[lVar6 + 0x17] = uVar4 & 1 ^ 1;
    *(byte *)((long)this->fStamp + lVar6 + -1) = (byte)(uVar4 & 1) ^ 1;
    uVar4 = uVar4 >> 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  dVar7 = dVar7 + (double)(local_40 + local_3c);
  dVar1 = uprv_floor_63(dVar7 / 86400000.0);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd;
  this->fFields[0x14] = (int)dVar1 + 0x253d8c;
  this->fStamp[0x14] = 1;
  this->fIsSet[0x14] = '\x01';
  computeGregorianAndDOWFields(this,(int)dVar1 + 0x253d8c,ec_00);
  (*(this->super_UObject)._vptr_UObject[0x29])(this,(ulong)(uint)this->fFields[0x14],ec);
  computeWeekFields(this,ec);
  iVar5 = (int)(dVar7 - (double)(int)(double)local_38._0_8_ * 86400000.0);
  this->fFields[0x15] = iVar5;
  this->fFields[0xe] = iVar5 % 1000;
  this->fFields[0xd] = (iVar5 / 1000) % 0x3c;
  this->fFields[0xc] = (iVar5 / 60000) % 0x3c;
  iVar2 = iVar5 / 3600000;
  this->fFields[0xb] = iVar2;
  this->fFields[9] = iVar5 / 43200000;
  uVar3 = (ushort)((uint)(iVar2 * 0x2aab) >> 0x10);
  this->fFields[10] = (int)(short)((short)iVar2 + ((uVar3 >> 1) - ((short)uVar3 >> 0xf)) * -0xc);
  this->fFields[0xf] = local_3c;
  this->fFields[0x10] = local_40;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }